

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesCMakeEnvironment(cmFindPackageCommand *this)

{
  mapped_type *this_00;
  allocator local_31;
  string local_30;
  
  this_00 = std::
            map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
            ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                         &cmFindCommon::PathLabel::CMakeEnvironment);
  cmSearchPath::AddEnvPath(this_00,&this->Variable);
  std::__cxx11::string::string((string *)&local_30,"CMAKE_PREFIX_PATH",&local_31);
  cmSearchPath::AddEnvPath(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"CMAKE_FRAMEWORK_PATH",&local_31);
  cmSearchPath::AddEnvPath(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,"CMAKE_APPBUNDLE_PATH",&local_31);
  cmSearchPath::AddEnvPath(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesCMakeEnvironment()
{
  cmSearchPath& paths = this->LabeledPaths[PathLabel::CMakeEnvironment];

  // Check the environment variable with the same name as the cache
  // entry.
  paths.AddEnvPath(this->Variable);

  // And now the general CMake environment variables
  paths.AddEnvPath("CMAKE_PREFIX_PATH");
  paths.AddEnvPath("CMAKE_FRAMEWORK_PATH");
  paths.AddEnvPath("CMAKE_APPBUNDLE_PATH");
}